

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void flatbuffers::tests::anon_unknown_0::FixedLengthArrayJsonTest
               (string *tests_data_path,bool binary)

{
  bool bVar1;
  SizeT SVar2;
  SizeT val;
  int expval;
  flatbuffers *pfVar3;
  uint8_t *puVar4;
  size_t sVar5;
  uint8_t *__s2;
  undefined8 in_RCX;
  string *buf;
  char *pcVar6;
  undefined1 local_16e0 [8];
  Verifier verifierGen;
  string jsonGen;
  Verifier verifierOrg;
  Verifier verifier;
  undefined1 local_12d8 [8];
  Parser parserGen;
  undefined1 local_848 [8];
  Parser parserOrg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58 [8];
  string jsonfile;
  string schemafile;
  bool binary_local;
  string *tests_data_path_local;
  
  std::__cxx11::string::string((string *)(jsonfile.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_58);
  std::operator+(&local_98,tests_data_path,"arrays_test.");
  buf = (string *)CONCAT71((int7)((ulong)in_RCX >> 8),binary);
  pcVar6 = "fbs";
  if (binary) {
    pcVar6 = "bfbs";
  }
  std::operator+(&local_78,&local_98,pcVar6);
  pfVar3 = (flatbuffers *)std::__cxx11::string::c_str();
  bVar1 = LoadFile(pfVar3,(char *)(ulong)(binary & 1),(bool)((char)&jsonfile + '\x18'),buf);
  pcVar6 = 
  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test.cpp";
  TestEq<bool,bool>(bVar1,true,
                    "\'flatbuffers::LoadFile( (tests_data_path + \"arrays_test.\" + (binary ? \"bfbs\" : \"fbs\")) .c_str(), binary, &schemafile)\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test.cpp"
                    ,0x3a6,"");
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &parserOrg.anonymous_counter_,tests_data_path,"arrays_test.golden");
  pfVar3 = (flatbuffers *)std::__cxx11::string::c_str();
  bVar1 = LoadFile(pfVar3,(char *)0x0,SUB81(local_58,0),(string *)pcVar6);
  TestEq<bool,bool>(bVar1,true,
                    "\'flatbuffers::LoadFile((tests_data_path + \"arrays_test.golden\").c_str(), false, &jsonfile)\' != \'true\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test.cpp"
                    ,0x3aa,"");
  std::__cxx11::string::~string((string *)&parserOrg.anonymous_counter_);
  IDLOptions::IDLOptions((IDLOptions *)&parserGen.anonymous_counter_);
  Parser::Parser((Parser *)local_848,(IDLOptions *)&parserGen.anonymous_counter_);
  IDLOptions::~IDLOptions((IDLOptions *)&parserGen.anonymous_counter_);
  IDLOptions::IDLOptions((IDLOptions *)&verifier.flex_reuse_tracker_);
  Parser::Parser((Parser *)local_12d8,(IDLOptions *)&verifier.flex_reuse_tracker_);
  IDLOptions::~IDLOptions((IDLOptions *)&verifier.flex_reuse_tracker_);
  if (binary) {
    puVar4 = (uint8_t *)std::__cxx11::string::c_str();
    sVar5 = std::__cxx11::string::size();
    VerifierTemplate<false>::VerifierTemplate
              ((VerifierTemplate<false> *)&verifierOrg.flex_reuse_tracker_,puVar4,sVar5,0x40,1000000
               ,true);
    bVar1 = reflection::VerifySchemaBuffer((Verifier *)&verifierOrg.flex_reuse_tracker_);
    TestEq<bool,bool>(bVar1,true,"\'reflection::VerifySchemaBuffer(verifier)\' != \'true\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test.cpp"
                      ,0x3b2,"");
    puVar4 = (uint8_t *)std::__cxx11::string::c_str();
    sVar5 = std::__cxx11::string::size();
    bVar1 = Parser::Deserialize((Parser *)local_848,puVar4,sVar5);
    TestEq<bool,bool>(bVar1,true,
                      "\'parserOrg.Deserialize( reinterpret_cast<const uint8_t *>(schemafile.c_str()), schemafile.size())\' != \'true\'"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test.cpp"
                      ,0x3b6,"");
    puVar4 = (uint8_t *)std::__cxx11::string::c_str();
    sVar5 = std::__cxx11::string::size();
    bVar1 = Parser::Deserialize((Parser *)local_12d8,puVar4,sVar5);
    TestEq<bool,bool>(bVar1,true,
                      "\'parserGen.Deserialize( reinterpret_cast<const uint8_t *>(schemafile.c_str()), schemafile.size())\' != \'true\'"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test.cpp"
                      ,0x3ba,"");
  }
  else {
    pcVar6 = (char *)std::__cxx11::string::c_str();
    bVar1 = Parser::Parse((Parser *)local_848,pcVar6,(char **)0x0,(char *)0x0);
    TestEq<bool,bool>(bVar1,true,"\'parserOrg.Parse(schemafile.c_str())\' != \'true\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test.cpp"
                      ,0x3bc,"");
    pcVar6 = (char *)std::__cxx11::string::c_str();
    bVar1 = Parser::Parse((Parser *)local_12d8,pcVar6,(char **)0x0,(char *)0x0);
    TestEq<bool,bool>(bVar1,true,"\'parserGen.Parse(schemafile.c_str())\' != \'true\'",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test.cpp"
                      ,0x3bd,"");
  }
  pcVar6 = (char *)std::__cxx11::string::c_str();
  bVar1 = Parser::Parse((Parser *)local_848,pcVar6,(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(bVar1,true,"\'parserOrg.Parse(jsonfile.c_str())\' != \'true\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test.cpp"
                    ,0x3bf,"");
  puVar4 = FlatBufferBuilderImpl<false>::GetBufferPointer
                     ((FlatBufferBuilderImpl<false> *)((long)&parserOrg.error_.field_2 + 8));
  SVar2 = FlatBufferBuilderImpl<false>::GetSize
                    ((FlatBufferBuilderImpl<false> *)((long)&parserOrg.error_.field_2 + 8));
  VerifierTemplate<false>::VerifierTemplate
            ((VerifierTemplate<false> *)((long)&jsonGen.field_2 + 8),puVar4,(ulong)SVar2,0x40,
             1000000,true);
  bVar1 = MyGame::Example::VerifyArrayTableBuffer((Verifier *)((long)&jsonGen.field_2 + 8));
  TestEq<bool,bool>(bVar1,true,"\'VerifyArrayTableBuffer(verifierOrg)\' != \'true\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test.cpp"
                    ,0x3c4,"");
  std::__cxx11::string::string((string *)&verifierGen.flex_reuse_tracker_);
  puVar4 = FlatBufferBuilderImpl<false>::GetBufferPointer
                     ((FlatBufferBuilderImpl<false> *)((long)&parserOrg.error_.field_2 + 8));
  pcVar6 = GenText((Parser *)local_848,puVar4,(string *)&verifierGen.flex_reuse_tracker_);
  TestEq<bool,bool>(true,pcVar6 == (char *)0x0,
                    "\'nullptr\' != \'GenText(parserOrg, parserOrg.builder_.GetBufferPointer(), &jsonGen)\'"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test.cpp"
                    ,0x3c9,"");
  pcVar6 = (char *)std::__cxx11::string::c_str();
  bVar1 = Parser::Parse((Parser *)local_12d8,pcVar6,(char **)0x0,(char *)0x0);
  TestEq<bool,bool>(bVar1,true,"\'parserGen.Parse(jsonGen.c_str())\' != \'true\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test.cpp"
                    ,0x3cc,"");
  puVar4 = FlatBufferBuilderImpl<false>::GetBufferPointer
                     ((FlatBufferBuilderImpl<false> *)((long)&parserGen.error_.field_2 + 8));
  SVar2 = FlatBufferBuilderImpl<false>::GetSize
                    ((FlatBufferBuilderImpl<false> *)((long)&parserGen.error_.field_2 + 8));
  VerifierTemplate<false>::VerifierTemplate
            ((VerifierTemplate<false> *)local_16e0,puVar4,(ulong)SVar2,0x40,1000000,true);
  bVar1 = MyGame::Example::VerifyArrayTableBuffer((Verifier *)local_16e0);
  TestEq<bool,bool>(bVar1,true,"\'VerifyArrayTableBuffer(verifierGen)\' != \'true\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test.cpp"
                    ,0x3d1,"");
  SVar2 = FlatBufferBuilderImpl<false>::GetSize
                    ((FlatBufferBuilderImpl<false> *)((long)&parserOrg.error_.field_2 + 8));
  val = FlatBufferBuilderImpl<false>::GetSize
                  ((FlatBufferBuilderImpl<false> *)((long)&parserGen.error_.field_2 + 8));
  TestEq<unsigned_int,unsigned_int>
            (SVar2,val,"\'parserOrg.builder_.GetSize()\' != \'parserGen.builder_.GetSize()\'",
             "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test.cpp"
             ,0x3d4,"");
  puVar4 = FlatBufferBuilderImpl<false>::GetBufferPointer
                     ((FlatBufferBuilderImpl<false> *)((long)&parserOrg.error_.field_2 + 8));
  __s2 = FlatBufferBuilderImpl<false>::GetBufferPointer
                   ((FlatBufferBuilderImpl<false> *)((long)&parserGen.error_.field_2 + 8));
  SVar2 = FlatBufferBuilderImpl<false>::GetSize
                    ((FlatBufferBuilderImpl<false> *)((long)&parserOrg.error_.field_2 + 8));
  expval = memcmp(puVar4,__s2,(ulong)SVar2);
  TestEq<int,int>(expval,0,
                  "\'std::memcmp(parserOrg.builder_.GetBufferPointer(), parserGen.builder_.GetBufferPointer(), parserOrg.builder_.GetSize())\' != \'0\'"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/tests/test.cpp"
                  ,0x3d8,"");
  std::__cxx11::string::~string((string *)&verifierGen.flex_reuse_tracker_);
  Parser::~Parser((Parser *)local_12d8);
  Parser::~Parser((Parser *)local_848);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string((string *)(jsonfile.field_2._M_local_buf + 8));
  return;
}

Assistant:

void FixedLengthArrayJsonTest(const std::string &tests_data_path, bool binary) {
  // load FlatBuffer schema (.fbs) and JSON from disk
  std::string schemafile;
  std::string jsonfile;
  TEST_EQ(flatbuffers::LoadFile(
              (tests_data_path + "arrays_test." + (binary ? "bfbs" : "fbs"))
                  .c_str(),
              binary, &schemafile),
          true);
  TEST_EQ(
      flatbuffers::LoadFile((tests_data_path + "arrays_test.golden").c_str(),
                            false, &jsonfile),
      true);

  // parse schema first, so we can use it to parse the data after
  flatbuffers::Parser parserOrg, parserGen;
  if (binary) {
    flatbuffers::Verifier verifier(
        reinterpret_cast<const uint8_t *>(schemafile.c_str()),
        schemafile.size());
    TEST_EQ(reflection::VerifySchemaBuffer(verifier), true);
    TEST_EQ(parserOrg.Deserialize(
                reinterpret_cast<const uint8_t *>(schemafile.c_str()),
                schemafile.size()),
            true);
    TEST_EQ(parserGen.Deserialize(
                reinterpret_cast<const uint8_t *>(schemafile.c_str()),
                schemafile.size()),
            true);
  } else {
    TEST_EQ(parserOrg.Parse(schemafile.c_str()), true);
    TEST_EQ(parserGen.Parse(schemafile.c_str()), true);
  }
  TEST_EQ(parserOrg.Parse(jsonfile.c_str()), true);

  // First, verify it, just in case:
  flatbuffers::Verifier verifierOrg(parserOrg.builder_.GetBufferPointer(),
                                    parserOrg.builder_.GetSize());
  TEST_EQ(VerifyArrayTableBuffer(verifierOrg), true);

  // Export to JSON
  std::string jsonGen;
  TEST_NULL(
      GenText(parserOrg, parserOrg.builder_.GetBufferPointer(), &jsonGen));

  // Import from JSON
  TEST_EQ(parserGen.Parse(jsonGen.c_str()), true);

  // Verify buffer from generated JSON
  flatbuffers::Verifier verifierGen(parserGen.builder_.GetBufferPointer(),
                                    parserGen.builder_.GetSize());
  TEST_EQ(VerifyArrayTableBuffer(verifierGen), true);

  // Compare generated buffer to original
  TEST_EQ(parserOrg.builder_.GetSize(), parserGen.builder_.GetSize());
  TEST_EQ(std::memcmp(parserOrg.builder_.GetBufferPointer(),
                      parserGen.builder_.GetBufferPointer(),
                      parserOrg.builder_.GetSize()),
          0);
}